

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

uint32_t utrie2_get32_63(UTrie2 *trie,UChar32 c)

{
  int iVar1;
  uint uVar2;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  UChar32 c_local;
  UTrie2 *trie_local;
  
  uVar2 = c >> 5;
  if (trie->data16 == (uint16_t *)0x0) {
    if (trie->data32 == (uint32_t *)0x0) {
      if ((uint)c < 0x110000) {
        trie_local._4_4_ = get32(trie->newTrie,c,'\x01');
      }
      else {
        trie_local._4_4_ = trie->errorValue;
      }
    }
    else {
      if ((uint)c < 0xd800) {
        local_44 = (uint)trie->index[(int)uVar2] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x10000) {
          iVar1 = 0;
          if (c < 0xdc00) {
            iVar1 = 0x140;
          }
          local_48 = (uint)trie->index[(int)(iVar1 + uVar2)] * 4 + (c & 0x1fU);
        }
        else {
          if ((uint)c < 0x110000) {
            if (c < trie->highStart) {
              local_50 = (uint)trie->index
                               [(int)((uint)trie->index[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))] * 4 +
                         (c & 0x1fU);
            }
            else {
              local_50 = trie->highValueIndex;
            }
            local_4c = local_50;
          }
          else {
            local_4c = 0x80;
          }
          local_48 = local_4c;
        }
        local_44 = local_48;
      }
      trie_local._4_4_ = trie->data32[local_44];
    }
  }
  else {
    if ((uint)c < 0xd800) {
      local_2c = (uint)trie->index[(int)uVar2] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x10000) {
        iVar1 = 0;
        if (c < 0xdc00) {
          iVar1 = 0x140;
        }
        local_30 = (uint)trie->index[(int)(iVar1 + uVar2)] * 4 + (c & 0x1fU);
      }
      else {
        if ((uint)c < 0x110000) {
          if (c < trie->highStart) {
            local_38 = (uint)trie->index
                             [(int)((uint)trie->index[(c >> 0xb) + 0x820] + (uVar2 & 0x3f))] * 4 +
                       (c & 0x1fU);
          }
          else {
            local_38 = trie->highValueIndex;
          }
          local_34 = local_38;
        }
        else {
          local_34 = trie->indexLength + 0x80;
        }
        local_30 = local_34;
      }
      local_2c = local_30;
    }
    trie_local._4_4_ = (uint)trie->index[local_2c];
  }
  return trie_local._4_4_;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
utrie2_get32(const UTrie2 *trie, UChar32 c) {
    if(trie->data16!=NULL) {
        return UTRIE2_GET16(trie, c);
    } else if(trie->data32!=NULL) {
        return UTRIE2_GET32(trie, c);
    } else if((uint32_t)c>0x10ffff) {
        return trie->errorValue;
    } else {
        return get32(trie->newTrie, c, TRUE);
    }
}